

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O0

ImageFeatureType_EnumeratedImageSizes * __thiscall
CoreML::Specification::ImageFeatureType::mutable_enumeratedsizes(ImageFeatureType *this)

{
  bool bVar1;
  ImageFeatureType_EnumeratedImageSizes *this_00;
  ImageFeatureType *this_local;
  
  bVar1 = has_enumeratedsizes(this);
  if (!bVar1) {
    clear_SizeFlexibility(this);
    set_has_enumeratedsizes(this);
    this_00 = (ImageFeatureType_EnumeratedImageSizes *)operator_new(0x30);
    ImageFeatureType_EnumeratedImageSizes::ImageFeatureType_EnumeratedImageSizes(this_00);
    (this->SizeFlexibility_).enumeratedsizes_ = this_00;
  }
  return (this->SizeFlexibility_).enumeratedsizes_;
}

Assistant:

inline ::CoreML::Specification::ImageFeatureType_EnumeratedImageSizes* ImageFeatureType::mutable_enumeratedsizes() {
  if (!has_enumeratedsizes()) {
    clear_SizeFlexibility();
    set_has_enumeratedsizes();
    SizeFlexibility_.enumeratedsizes_ = new ::CoreML::Specification::ImageFeatureType_EnumeratedImageSizes;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ImageFeatureType.enumeratedSizes)
  return SizeFlexibility_.enumeratedsizes_;
}